

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O1

void send_and_maybe_wait_for_handshake(CManager_conflict cm,CMConnection conn)

{
  transport_entry p_Var1;
  FILE *pFVar2;
  int iVar3;
  int iVar4;
  __pid_t _Var5;
  attr_list p_Var6;
  pthread_t pVar7;
  bool bVar8;
  int msg [5];
  FFSEncodeVec tmp_vec [1];
  timespec ts;
  ulong local_78;
  int local_70;
  uint local_6c;
  undefined4 local_68;
  undefined1 *local_58;
  undefined8 local_50;
  timespec local_40;
  
  local_78 = local_78 & 0xffffffff00000000;
  p_Var1 = conn->trans;
  if (p_Var1->get_transport_characteristics == (CMTransport_get_transport_characteristics)0x0) {
    bVar8 = false;
  }
  else {
    p_Var6 = (*p_Var1->get_transport_characteristics)
                       (p_Var1,&CMstatic_trans_svcs,p_Var1->trans_data);
    get_int_attr(p_Var6,CM_TRANSPORT_RELIABLE,&local_78);
    free_attr_list(p_Var6);
    bVar8 = (int)local_78 != 0;
  }
  if (cm->FFSserver_identifier == 0) {
    cm->FFSserver_identifier = -1;
  }
  local_78 = 0x1000014434d4800;
  local_70 = cm->FFSserver_identifier;
  local_6c = cm->CManager_ID;
  local_68 = 0;
  if (conn->remote_format_server_ID != 0) {
    local_6c = local_6c | 0x80000000;
  }
  local_50 = 0x14;
  local_58 = (undefined1 *)&local_78;
  iVar3 = CMtrace_val[3];
  if (conn->cm->CMTrace_file == (FILE *)0x0) {
    local_58 = (undefined1 *)&local_78;
    iVar3 = CMtrace_init(conn->cm,CMLowLevelVerbose);
  }
  if (iVar3 != 0) {
    if (CMtrace_PID != 0) {
      pFVar2 = (FILE *)conn->cm->CMTrace_file;
      _Var5 = getpid();
      pVar7 = pthread_self();
      fprintf(pFVar2,"P%lxT%lx - ",(long)_Var5,pVar7);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_40);
      fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
    }
    fwrite("CM - sending handshake\n",0x17,1,(FILE *)conn->cm->CMTrace_file);
  }
  fflush((FILE *)conn->cm->CMTrace_file);
  if ((bool)(conn->remote_format_server_ID == 0 & bVar8)) {
    iVar3 = INT_CMCondition_get(cm,conn);
    conn->handshake_condition = iVar3;
  }
  iVar4 = (*conn->trans->writev_func)
                    (&CMstatic_trans_svcs,conn->transport_data,&local_58,1,(attr_list)0x0);
  iVar3 = CMtrace_val[3];
  if (conn->cm->CMTrace_file == (FILE *)0x0) {
    iVar3 = CMtrace_init(conn->cm,CMLowLevelVerbose);
  }
  if (iVar3 != 0) {
    if (CMtrace_PID != 0) {
      pFVar2 = (FILE *)conn->cm->CMTrace_file;
      _Var5 = getpid();
      pVar7 = pthread_self();
      fprintf(pFVar2,"P%lxT%lx - ",(long)_Var5,pVar7);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_40);
      fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
    }
    fprintf((FILE *)conn->cm->CMTrace_file,"CM - after handshake, pending is %d\n",
            (ulong)(uint)conn->write_pending);
  }
  fflush((FILE *)conn->cm->CMTrace_file);
  if (conn->write_pending != 0) {
    wait_for_pending_write(conn);
  }
  if (iVar4 != 1) {
    puts("handshake write failed");
  }
  if ((bool)(conn->remote_format_server_ID == 0 & bVar8)) {
    iVar3 = CMtrace_val[3];
    if (conn->cm->CMTrace_file == (FILE *)0x0) {
      iVar3 = CMtrace_init(conn->cm,CMLowLevelVerbose);
    }
    if (iVar3 != 0) {
      if (CMtrace_PID != 0) {
        pFVar2 = (FILE *)conn->cm->CMTrace_file;
        _Var5 = getpid();
        pVar7 = pthread_self();
        fprintf(pFVar2,"P%lxT%lx - ",(long)_Var5,pVar7);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_40);
        fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
      }
      fwrite("CM - waiting for handshake response\n",0x24,1,(FILE *)conn->cm->CMTrace_file);
    }
    fflush((FILE *)conn->cm->CMTrace_file);
    INT_CMCondition_wait(cm,conn->handshake_condition);
  }
  return;
}

Assistant:

static
 void
 send_and_maybe_wait_for_handshake(CManager cm, CMConnection conn)
 {
     struct FFSEncodeVec tmp_vec[1];
     int reliable = transport_is_reliable(conn);
     int msg[5], actual;
     if (!cm->FFSserver_identifier) cm->FFSserver_identifier = -1;
     msg[0] = 0x434d4800;  /* CMH\0 */
     msg[1] = (CURRENT_HANDSHAKE_VERSION << 24) + sizeof(msg);
     msg[2] = cm->FFSserver_identifier;
     msg[3] = cm->CManager_ID;
     msg[4] = 0;  /* not implemented yet */
     if (conn->remote_format_server_ID != 0) {
	 /* set high bit if we already have his ID */
	 msg[3] |= 0x80000000;
     }
     tmp_vec[0].iov_base = &msg;
     tmp_vec[0].iov_len = sizeof(msg);
     CMtrace_out(conn->cm, CMLowLevelVerbose, "CM - sending handshake\n");
     if ((conn->remote_format_server_ID == 0) && reliable) {
	 /* we will await his respone */
	 conn->handshake_condition = INT_CMCondition_get(cm, conn);
     }
     actual = conn->trans->writev_func(&CMstatic_trans_svcs, 
				       conn->transport_data, 
				       &tmp_vec[0], 1, NULL);

     CMtrace_out(conn->cm, CMLowLevelVerbose, "CM - after handshake, pending is %d\n", conn->write_pending);
     if (conn->write_pending) {
	 wait_for_pending_write(conn);
     }
     if (actual != 1) {
	 printf("handshake write failed\n");
     }
     if ((conn->remote_format_server_ID == 0) && reliable) {
	 CMtrace_out(conn->cm, CMLowLevelVerbose, "CM - waiting for handshake response\n");
	 INT_CMCondition_wait(cm, conn->handshake_condition);
     }
 }